

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<siginfo_t> * __thiscall
kj::_::ExceptionOr<siginfo_t>::operator=
          (ExceptionOr<siginfo_t> *this,ExceptionOr<siginfo_t> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<siginfo_t>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;